

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationsettings.cpp
# Opt level: O3

void __thiscall
icu_63::CollationSettings::aliasReordering
          (CollationSettings *this,CollationData *data,int32_t *codes,int32_t length,
          uint32_t *ranges,int32_t rangesLength,uint8_t *table,UErrorCode *errorCode)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  int iVar4;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if (table == (uint8_t *)0x0) goto LAB_00238003;
    if (rangesLength == 0) {
      if (table[1] == '\0') {
LAB_00238003:
        setReordering(this,data,codes,length,errorCode);
        return;
      }
      uVar3 = 0;
      do {
        if (uVar3 == 0xfe) goto LAB_0023801f;
        uVar1 = uVar3 + 1;
        lVar2 = uVar3 + 2;
        uVar3 = uVar1;
      } while (table[lVar2] != '\0');
      if (uVar1 < 0xff) goto LAB_00238003;
    }
    else if (((rangesLength < 2) || ((short)*ranges != 0)) ||
            ((short)ranges[(ulong)(uint)rangesLength - 1] == 0)) goto LAB_00238003;
LAB_0023801f:
    if (this->reorderCodesCapacity != 0) {
      uprv_free_63(this->reorderCodes);
      this->reorderCodesCapacity = 0;
    }
    this->reorderTable = table;
    this->reorderCodes = codes;
    this->reorderCodesLength = length;
    if (rangesLength < 1) {
      uVar3 = 0;
LAB_0023805d:
      iVar4 = rangesLength - (int)uVar3;
      if (iVar4 != 0) {
        this->minHighNoReorder =
             (uint)*(ushort *)((long)ranges + (long)rangesLength * 4 + -2) << 0x10;
        this->reorderRanges = ranges + (uVar3 & 0xffffffff);
        this->reorderRangesLength = iVar4;
        return;
      }
    }
    else {
      uVar3 = 0;
      do {
        if (*(char *)((long)ranges + uVar3 * 4 + 2) != '\0') goto LAB_0023805d;
        uVar3 = uVar3 + 1;
      } while ((uint)rangesLength != uVar3);
    }
    this->minHighNoReorder = 0;
    this->reorderRanges = (uint32_t *)0x0;
    this->reorderRangesLength = 0;
  }
  return;
}

Assistant:

void
CollationSettings::aliasReordering(const CollationData &data, const int32_t *codes, int32_t length,
                                   const uint32_t *ranges, int32_t rangesLength,
                                   const uint8_t *table, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return; }
    if(table != NULL &&
            (rangesLength == 0 ?
                    !reorderTableHasSplitBytes(table) :
                    rangesLength >= 2 &&
                    // The first offset must be 0. The last offset must not be 0.
                    (ranges[0] & 0xffff) == 0 && (ranges[rangesLength - 1] & 0xffff) != 0)) {
        // We need to release the memory before setting the alias pointer.
        if(reorderCodesCapacity != 0) {
            uprv_free(const_cast<int32_t *>(reorderCodes));
            reorderCodesCapacity = 0;
        }
        reorderTable = table;
        reorderCodes = codes;
        reorderCodesLength = length;
        // Drop ranges before the first split byte. They are reordered by the table.
        // This then speeds up reordering of the remaining ranges.
        int32_t firstSplitByteRangeIndex = 0;
        while(firstSplitByteRangeIndex < rangesLength &&
                (ranges[firstSplitByteRangeIndex] & 0xff0000) == 0) {
            // The second byte of the primary limit is 0.
            ++firstSplitByteRangeIndex;
        }
        if(firstSplitByteRangeIndex == rangesLength) {
            U_ASSERT(!reorderTableHasSplitBytes(table));
            minHighNoReorder = 0;
            reorderRanges = NULL;
            reorderRangesLength = 0;
        } else {
            U_ASSERT(table[ranges[firstSplitByteRangeIndex] >> 24] == 0);
            minHighNoReorder = ranges[rangesLength - 1] & 0xffff0000;
            reorderRanges = ranges + firstSplitByteRangeIndex;
            reorderRangesLength = rangesLength - firstSplitByteRangeIndex;
        }
        return;
    }
    // Regenerate missing data.
    setReordering(data, codes, length, errorCode);
}